

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_data_to_file.cpp
# Opt level: O3

void create_folder(char *folder_name)

{
  int iVar1;
  stat st;
  stat local_98;
  
  local_98.__unused[1] = 0;
  local_98.__unused[2] = 0;
  local_98.st_blocks = 0;
  local_98.st_atim.tv_sec = 0;
  local_98.st_atim.tv_nsec = 0;
  local_98.st_mtim.tv_sec = 0;
  local_98.st_mtim.tv_nsec = 0;
  local_98.st_ctim.tv_sec = 0;
  local_98.st_ctim.tv_nsec = 0;
  local_98.__unused[0] = 0;
  local_98.st_dev = 0;
  local_98.st_ino = 0;
  local_98.st_nlink = 0;
  local_98.st_mode = 0;
  local_98.st_uid = 0;
  local_98.st_gid = 0;
  local_98.__pad0 = 0;
  local_98.st_rdev = 0;
  local_98.st_size = 0;
  local_98.st_blksize = 0;
  iVar1 = stat(folder_name,&local_98);
  if (iVar1 != -1) {
    return;
  }
  mkdir(folder_name,0x1c0);
  return;
}

Assistant:

void create_folder(const char *folder_name) {
    // create the folder if it doesn't exist
    struct stat st = {0};
    if (stat(folder_name, &st) == -1) {
#ifndef _WIN32
        mkdir(folder_name, 0700);
#else
        _mkdir(folder_name);
#endif
    }
}